

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::detail::fallback_format<long_double>(longdouble d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  bigint lower;
  bigint denominator;
  bigint numerator;
  bigint upper_store;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00116d20;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00116d20;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00116d20;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00116d20;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  local_190.bigits_.store_[0] = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 1;
  local_190.exp_ = 0;
  bigint::operator<<=(&local_190,0);
  *local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
  if (local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
    (**local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer)();
  }
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 1;
  local_2f0.exp_ = 0;
  bigint::operator<<=(&local_2f0,0);
  bigint::assign_pow10(&local_240,*exp10);
  bigint::operator<<=(&local_240,1);
  pcVar1 = buf->ptr_;
  lVar7 = 0;
  while( true ) {
    uVar3 = bigint::divmod_assign(&local_190,&local_240);
    iVar4 = compare(&local_190,&local_2f0);
    iVar5 = add_compare(&local_190,&local_2f0,&local_240);
    pcVar1[lVar7] = (char)uVar3 + '0';
    if ((iVar4 < 1) || (-1 < iVar5)) break;
    bigint::multiply(&local_190,10);
    lVar7 = lVar7 + 1;
    bigint::multiply(&local_2f0,10);
  }
  if (iVar4 < 1) {
    if (iVar5 < 0) goto LAB_00107976;
    iVar4 = add_compare(&local_190,&local_190,&local_240);
    if ((iVar4 < 1) && ((uVar3 & 1) == 0 || iVar4 != 0)) goto LAB_00107976;
    cVar2 = pcVar1[lVar7] + '\x01';
  }
  else {
    cVar2 = (char)uVar3 + '1';
  }
  pcVar1[lVar7] = cVar2;
LAB_00107976:
  uVar6 = lVar7 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar6) {
    (**buf->_vptr_buffer)(buf,uVar6);
  }
  buf->size_ = uVar6;
  *exp10 = *exp10 - (int)lVar7;
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_2f0);
  bigint::~bigint(&local_240);
  bigint::~bigint(&local_190);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}